

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fout.cpp
# Opt level: O2

void write_binary_yzplane<double>
               (ofstream *f,field3d<double> *data,_func_double_field3d<double>_ptr_int_int_int *get,
               int i,int ny,int nz)

{
  void *pvVar1;
  void *pvVar2;
  int k;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  
  uVar4 = 0xffffffffffffffff;
  if (-1 < nz * ny) {
    uVar4 = (long)(nz * ny) * 8;
  }
  pvVar1 = operator_new__(uVar4);
  pvVar2 = pvVar1;
  for (uVar4 = 0; uVar4 != (uint)(~(ny >> 0x1f) & ny); uVar4 = uVar4 + 1) {
    for (uVar3 = 0; (uint)(~(nz >> 0x1f) & nz) != uVar3; uVar3 = uVar3 + 1) {
      dVar5 = (*get)(data,i,(int)uVar4,(int)uVar3);
      *(double *)((long)pvVar2 + uVar3 * 8) = dVar5;
    }
    pvVar2 = (void *)((long)pvVar2 + (long)nz * 8);
  }
  std::ostream::write((char *)f,(long)pvVar1);
  operator_delete__(pvVar1);
  return;
}

Assistant:

void write_binary_yzplane(ofstream* f, field3d<T> & data, double
        get(field3d<T>&, int, int, int), int i, int ny, int nz) {
    double* a = new double[ny * nz];
    for(int j=0;j<ny;j++)
        for(int k=0;k<nz;k++)
            a[j * nz + k] = get(data, i, j, k);
    f->write(reinterpret_cast<char*>(a), sizeof(double) * (ny * nz));
    delete[] a;
}